

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::Synchronize(WastParser *this,SynchronizeFunc func)

{
  bool bVar1;
  TokenType TVar2;
  char *format;
  string local_b0;
  size_t local_90;
  size_t local_88;
  char *local_80;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_78;
  undefined1 local_70 [8];
  Token token;
  int local_24;
  int i;
  SynchronizeFunc func_local;
  WastParser *this_local;
  
  local_24 = 0;
  while( true ) {
    if (9 < local_24) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    register0x00000000 = PeekPair(this);
    bVar1 = (*func)((TokenTypePair)register0x00000000);
    if (bVar1) break;
    Consume((Token *)local_70,this);
    TVar2 = Token::token_type((Token *)local_70);
    if (TVar2 == Reserved) {
      local_90 = (size_t)local_70;
      local_88 = token.loc.filename._M_len;
      local_80 = token.loc.filename._M_str;
      local_78.offset = (size_t)token.loc.field_1.field_1.offset;
      Token::to_string_clamp_abi_cxx11_(&local_b0,(Token *)local_70,0x50);
      format = (char *)std::__cxx11::string::c_str();
      Error(this,0x24a229,format);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    local_24 = local_24 + 1;
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::Synchronize(SynchronizeFunc func) {
  static const int kMaxConsumed = 10;
  for (int i = 0; i < kMaxConsumed; ++i) {
    if (func(PeekPair())) {
      return Result::Ok;
    }

    Token token = Consume();
    if (token.token_type() == TokenType::Reserved) {
      Error(token.loc, "unexpected token %s.",
            token.to_string_clamp(kMaxErrorTokenLength).c_str());
    }
  }

  return Result::Error;
}